

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>,_0,_0>
       ::run(redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
             *mat,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  long lVar2;
  Index IVar3;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_RSI;
  Index j;
  Index i_1;
  Index i;
  Scalar res;
  Index in_stack_ffffffffffffff88;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *in_stack_ffffffffffffff90;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *prVar4;
  CoeffReturnType local_40;
  long local_38;
  long local_30;
  CoeffReturnType local_28;
  long local_20;
  CoeffReturnType local_18;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  *local_10;
  
  local_10 = in_RSI;
  IVar3 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
          ::rows((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)0x159698);
  bVar1 = false;
  if (0 < IVar3) {
    IVar3 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
            ::cols((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)0x1596b1);
    bVar1 = false;
    if (0 < IVar3) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                  ,0xc0,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>>, Traversal = 0, Unrolling = 0]"
                 );
  }
  local_18 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
             ::coeffByOuterInner(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x159704);
  local_20 = 1;
  while( true ) {
    lVar2 = local_20;
    IVar3 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
            ::innerSize((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                         *)0x159727);
    prVar4 = local_10;
    if (IVar3 <= lVar2) break;
    local_28 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
               ::coeffByOuterInner(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x159751);
    local_18 = scalar_sum_op<double,_double>::operator()
                         ((scalar_sum_op<double,_double> *)prVar4,&local_18,&local_28);
    local_20 = local_20 + 1;
  }
  local_30 = 1;
  while( true ) {
    lVar2 = local_30;
    IVar3 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
            ::outerSize((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                         *)0x15979e);
    if (IVar3 <= lVar2) break;
    local_38 = 0;
    while( true ) {
      lVar2 = local_38;
      IVar3 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
              ::innerSize((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                           *)0x1597cc);
      if (IVar3 <= lVar2) break;
      prVar4 = local_10;
      local_40 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
                 ::coeffByOuterInner(local_10,in_stack_ffffffffffffff88,0x1597f7);
      local_18 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)prVar4,&local_18,&local_40);
      local_38 = local_38 + 1;
    }
    local_30 = local_30 + 1;
  }
  return local_18;
}

Assistant:

Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = mat.coeffByOuterInner(0, 0);
    for(Index i = 1; i < mat.innerSize(); ++i)
      res = func(res, mat.coeffByOuterInner(0, i));
    for(Index i = 1; i < mat.outerSize(); ++i)
      for(Index j = 0; j < mat.innerSize(); ++j)
        res = func(res, mat.coeffByOuterInner(i, j));
    return res;
  }